

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm.c
# Opt level: O3

double function_norm_C(double *node_values,uint dimension,_func_double_double *function)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (dimension < 3) {
    __assert_fail("dimension >= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tenpercent[P]navier-stokes/src/pdesolver/norm.c"
                  ,0x2c,"double function_norm_C(const double *, unsigned int, double (*)(double))");
  }
  dVar2 = (*function)(node_values[1]);
  dVar2 = ABS(dVar2);
  if (dimension != 3) {
    uVar1 = 2;
    dVar4 = dVar2;
    do {
      dVar3 = (*function)(node_values[uVar1]);
      dVar2 = ABS(dVar3);
      if (ABS(dVar3) <= dVar4) {
        dVar2 = dVar4;
      }
      uVar1 = uVar1 + 1;
      dVar4 = dVar2;
    } while (dimension - 1 != uVar1);
  }
  return dVar2;
}

Assistant:

double function_norm_C (double const * node_values,
                        unsigned dimension,
                        double (*function) (double)) {

  assert (dimension >= 3);

  double norm = fabs (function (node_values[1]));
  unsigned space_step;
  for (space_step = 2; space_step + 1 < dimension; ++space_step) {
    norm = max (fabs (function (node_values[space_step])), norm);
  }
  return norm;
}